

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::
find_insert_point(subtree_ref_base<false> *this,size_t index)

{
  size_t sVar1;
  word_type wVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  word_type wVar6;
  long lVar7;
  value_type vVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  bt_impl_t *pbVar15;
  ulong uVar16;
  ulong uVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  local_48;
  long local_38;
  
  pbVar15 = this->_vector;
  sVar1 = pbVar15->counter_width;
  uVar5 = (pbVar15->sizes)._width;
  wVar2 = (pbVar15->sizes)._field_mask;
  uVar9 = pbVar15->degree;
  uVar4 = wVar2 << ((ulong)((int)uVar5 - 1) & 0x3f);
  uVar5 = 0x40 / uVar5;
  uVar11 = uVar9 % uVar5;
  uVar12 = uVar9;
  uVar14 = 0;
  uVar17 = uVar9;
  while (uVar14 < uVar9) {
    uVar16 = uVar5;
    if (uVar12 < uVar5) {
      uVar16 = uVar11;
    }
    local_38 = uVar9 * this->_index;
    local_48._v = &pbVar15->sizes;
    local_48._index = uVar14 + local_38;
    local_38 = local_38 + uVar16 + uVar14;
    wVar6 = range_reference::operator_cast_to_unsigned_long((range_reference *)&local_48);
    lVar10 = uVar16 * sVar1;
    pbVar15 = this->_vector;
    bVar13 = 0x40 - (-(char)lVar10 & 0x3fU);
    sVar3 = (bVar13 < 0x41) * ('@' - bVar13);
    lVar7 = POPCOUNT(((wVar6 | uVar4) - wVar2 * index << sVar3) >> sVar3 & uVar4);
    if (lVar10 == 0) {
      lVar7 = 0;
    }
    uVar12 = uVar12 - uVar16;
    uVar17 = uVar17 - lVar7;
    uVar14 = uVar16 + uVar14;
    uVar9 = pbVar15->degree;
  }
  if (uVar17 != 0) {
    local_48._v = &pbVar15->sizes;
    local_48._index = (uVar17 - 1) + uVar9 * this->_index;
    vVar8 = item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
            ::value(&local_48);
    index = index - vVar8;
  }
  pVar18.second = index;
  pVar18.first = uVar17;
  return pVar18;
}

Assistant:

std::pair<size_t, size_t>
            find_insert_point(size_t index) const
            {
                assert(is_node());
                
                using word_type = typename packed_data::word_type;
                
                size_t len = degree();
                const word_type field_mask   = _vector.sizes.field_mask();
                const word_type flag_mask    = _vector.sizes.flag_mask();
                const size_t width           = _vector.counter_width;
                const size_t fields_per_word = _vector.sizes.elements_per_word();
                const size_t rem             = len % fields_per_word;
                
                ensure_bitsize(index, width - 1);
                
                size_t child = len;
                for(size_t step, p = 0; p < degree(); len -= step, p += step)
                {
                    step = len < fields_per_word ? rem : fields_per_word;
                    
                    word_type word = word_type(sizes(p, p + step)) |
                                     flag_mask;
                    
                    child -= popcount(lowbits(flag_mask &
                                              (word - index * field_mask),
                                              step * width));
                }
                
                assert(len == 0);
                
                size_t new_index = index;
                if(child > 0)
                    new_index -= sizes(child - 1);
                
                return { child, new_index };
            }